

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::pipeline::anon_unknown_0::RasterizationSamplesInstance::verifyImage
          (TestStatus *__return_storage_ptr__,RasterizationSamplesInstance *this,
          ConstPixelBufferAccess *result)

{
  ostringstream *this_00;
  TestLog *log;
  bool bVar1;
  deUint32 dVar2;
  PrimitiveType primitive;
  InstanceInterface *pIVar3;
  VkPhysicalDevice pVVar4;
  TextureFormat tcuColorFormat;
  TextureFormat tcuDepthFormat;
  ColorVertexShader vertexShader;
  ColorFragmentShader fragmentShader;
  ReferenceRenderer refRenderer;
  VkPhysicalDeviceProperties deviceProperties;
  RenderState renderState;
  Program program;
  TextureFormat local_5a8;
  TextureFormat local_5a0;
  VertexShader local_598;
  ColorFragmentShader local_560;
  ReferenceRenderer local_518;
  undefined1 local_468 [744];
  float local_180;
  undefined1 local_12c [196];
  long lStack_68;
  long local_60;
  LineState local_58;
  bool local_54;
  undefined8 local_50;
  Program local_48;
  
  dVar2 = getUniqueColorsCount(result);
  local_468._0_8_ = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  this_00 = (ostringstream *)(local_468 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"\nMin. unique colors expected: ",0x1e);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_00,"Unique colors found: ",0x15);
  std::ostream::_M_insert<unsigned_long>((ulong)this_00);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,"\n",1);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_468,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  std::ios_base::~ios_base((ios_base *)(local_468 + 0x78));
  if (dVar2 < 3) {
    local_468._0_8_ = (long)local_468 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_468,"Unique colors out of expected bounds","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_468._0_8_,
               (undefined1 *)(local_468._8_8_ + local_468._0_8_));
    if (local_468._0_8_ != (long)local_468 + 0x10) {
      operator_delete((void *)local_468._0_8_,local_468._16_8_ + 1);
    }
    if (dVar2 < 3) {
      return __return_storage_ptr__;
    }
  }
  local_5a8 = ::vk::mapVkFormat(this->m_colorFormat);
  local_5a0.order = CHANNELORDER_LAST;
  local_5a0.type = CHANNELTYPE_LAST;
  rr::VertexShader::VertexShader(&local_598,2,2);
  local_598._vptr_VertexShader = (_func_int **)&PTR_shadeVertices_00d20c80;
  *(undefined8 *)
   local_598.m_inputs.super__Vector_base<rr::VertexInputInfo,_std::allocator<rr::VertexInputInfo>_>.
   _M_impl.super__Vector_impl_data._M_start = 0;
  (local_598.m_outputs.
   super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
   super__Vector_impl_data._M_start)->type = GENERICVECTYPE_FLOAT;
  local_598.m_outputs.
  super__Vector_base<rr::VertexVaryingInfo,_std::allocator<rr::VertexVaryingInfo>_>._M_impl.
  super__Vector_impl_data._M_start[1].type = GENERICVECTYPE_FLOAT;
  ColorFragmentShader::ColorFragmentShader(&local_560,&local_5a8,&local_5a0);
  local_48.geometryShader = (GeometryShader *)0x0;
  local_48.vertexShader = &local_598;
  local_48.fragmentShader = &local_560.super_FragmentShader;
  ReferenceRenderer::ReferenceRenderer
            (&local_518,(this->m_renderSize).m_data[0],(this->m_renderSize).m_data[1],1,&local_5a8,
             &local_5a0,&local_48);
  ReferenceRenderer::getViewportState(&local_518);
  local_12c._0_4_ = CULLMODE_NONE;
  local_12c._4_4_ = PROVOKINGVERTEX_LAST;
  local_12c._8_4_ = WINDING_CCW;
  local_12c._12_4_ = FILL_LEFT;
  local_12c._16_8_ = 0x200000001;
  rr::FragmentOperationState::FragmentOperationState((FragmentOperationState *)(local_12c + 0x18));
  local_12c._184_4_ = 1.0;
  local_12c._188_8_ = local_468._0_8_;
  lStack_68 = local_468._8_8_;
  local_60 = local_468._16_8_;
  local_58.lineWidth = 1.0;
  local_54 = false;
  local_50._0_4_ = 0xffffffff;
  local_50._4_4_ = VIEWPORTORIENTATION_LOWER_LEFT;
  local_12c._16_8_ = local_12c._16_8_ & 0xffffffff;
  if (this->m_primitiveTopology == VK_PRIMITIVE_TOPOLOGY_POINT_LIST) {
    pIVar3 = Context::getInstanceInterface((this->super_TestInstance).m_context);
    pVVar4 = Context::getPhysicalDevice((this->super_TestInstance).m_context);
    (*pIVar3->_vptr_InstanceInterface[5])(pIVar3,pVVar4,local_468);
    local_12c._184_4_ = 3.0;
    if (local_180 <= 3.0) {
      local_12c._184_4_ = local_180;
    }
  }
  if (this->m_modeFlags == 0) {
    local_468._0_4_ = R;
    local_468._4_4_ = SNORM_INT8;
    local_468._8_8_ = 0;
    ReferenceRenderer::colorClear(&local_518,(Vec4 *)local_468);
  }
  else {
    local_468._0_4_ = 0x3f800000;
    local_468._4_4_ = SNORM_INT8;
    local_468._8_8_ = 0x3f80000000000000;
    ReferenceRenderer::colorClear(&local_518,(Vec4 *)local_468);
  }
  primitive = mapVkPrimitiveTopology(this->m_primitiveTopology);
  ReferenceRenderer::draw(&local_518,(RenderState *)local_12c,primitive,&this->m_vertices);
  log = ((this->super_TestInstance).m_context)->m_testCtx->m_log;
  ReferenceRenderer::getAccess((PixelBufferAccess *)local_468,&local_518);
  bVar1 = tcu::fuzzyCompare(log,"FuzzyImageCompare","Image comparison",
                            (ConstPixelBufferAccess *)local_468,result,0.05,COMPARE_LOG_RESULT);
  if (bVar1) {
    ReferenceRenderer::~ReferenceRenderer(&local_518);
    rr::FragmentShader::~FragmentShader(&local_560.super_FragmentShader);
    rr::VertexShader::~VertexShader(&local_598);
  }
  else {
    local_468._0_8_ = (long)local_468 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_468,"Primitive has unexpected shape","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_468._0_8_,
               (undefined1 *)(local_468._8_8_ + local_468._0_8_));
    if (local_468._0_8_ != (long)local_468 + 0x10) {
      operator_delete((void *)local_468._0_8_,local_468._16_8_ + 1);
    }
    ReferenceRenderer::~ReferenceRenderer(&local_518);
    rr::FragmentShader::~FragmentShader(&local_560.super_FragmentShader);
    rr::VertexShader::~VertexShader(&local_598);
    if (!bVar1) {
      return __return_storage_ptr__;
    }
  }
  local_468._0_8_ = (long)local_468 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_468,"Primitive rendered, unique colors within expected bounds","");
  __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
  (__return_storage_ptr__->m_description)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->m_description,local_468._0_8_,
             (undefined1 *)(local_468._8_8_ + local_468._0_8_));
  if (local_468._0_8_ != (long)local_468 + 0x10) {
    operator_delete((void *)local_468._0_8_,local_468._16_8_ + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus RasterizationSamplesInstance::verifyImage (const tcu::ConstPixelBufferAccess& result)
{
	// Verify range of unique pixels
	{
		const deUint32	numUniqueColors = getUniqueColorsCount(result);
		const deUint32	minUniqueColors	= 3;

		tcu::TestLog& log = m_context.getTestContext().getLog();

		log << tcu::TestLog::Message
			<< "\nMin. unique colors expected: " << minUniqueColors << "\n"
			<< "Unique colors found: " << numUniqueColors << "\n"
			<< tcu::TestLog::EndMessage;

		if (numUniqueColors < minUniqueColors)
			return tcu::TestStatus::fail("Unique colors out of expected bounds");
	}

	// Verify shape of the rendered primitive (fuzzy-compare)
	{
		const tcu::TextureFormat	tcuColorFormat	= mapVkFormat(m_colorFormat);
		const tcu::TextureFormat	tcuDepthFormat	= tcu::TextureFormat();
		const ColorVertexShader		vertexShader;
		const ColorFragmentShader	fragmentShader	(tcuColorFormat, tcuDepthFormat);
		const rr::Program			program			(&vertexShader, &fragmentShader);
		ReferenceRenderer			refRenderer		(m_renderSize.x(), m_renderSize.y(), 1, tcuColorFormat, tcuDepthFormat, &program);
		rr::RenderState				renderState		(refRenderer.getViewportState());

		if (m_primitiveTopology == VK_PRIMITIVE_TOPOLOGY_POINT_LIST)
		{
			VkPhysicalDeviceProperties deviceProperties;

			m_context.getInstanceInterface().getPhysicalDeviceProperties(m_context.getPhysicalDevice(), &deviceProperties);

			// gl_PointSize is clamped to pointSizeRange
			renderState.point.pointSize = deFloatMin(3.0f, deviceProperties.limits.pointSizeRange[1]);
		}

		if (m_modeFlags == 0)
		{
			refRenderer.colorClear(tcu::Vec4(0.0f));
			refRenderer.draw(renderState, mapVkPrimitiveTopology(m_primitiveTopology), m_vertices);
		}
		else
		{
			// For depth/stencil case the primitive is invisible and the surroundings are filled red.
			refRenderer.colorClear(tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f));
			refRenderer.draw(renderState, mapVkPrimitiveTopology(m_primitiveTopology), m_vertices);
		}

		if (!tcu::fuzzyCompare(m_context.getTestContext().getLog(), "FuzzyImageCompare", "Image comparison", refRenderer.getAccess(), result, 0.05f, tcu::COMPARE_LOG_RESULT))
			return tcu::TestStatus::fail("Primitive has unexpected shape");
	}

	return tcu::TestStatus::pass("Primitive rendered, unique colors within expected bounds");
}